

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O1

void __thiscall
TEST_MemoryLeakDetectorListTest_clearAllAccountingIsWorkingProperly_Test::testBody
          (TEST_MemoryLeakDetectorListTest_clearAllAccountingIsWorkingProperly_Test *this)

{
  UtestShell *pUVar1;
  MemoryLeakDetectorNode *pMVar2;
  TestTerminator *pTVar3;
  MemoryLeakDetectorList listForTesting;
  MemoryLeakDetectorNode node3;
  MemoryLeakDetectorNode node2;
  MemoryLeakDetectorNode node1;
  
  listForTesting.head_ = (MemoryLeakDetectorNode *)0x0;
  node1.size_ = 0;
  node1.number_ = 0;
  node1.memory_ = (char *)0x0;
  node1.file_ = (char *)0x0;
  node1.line_ = 0;
  node1.allocator_ = (TestMemoryAllocator *)0x0;
  node1.period_ = mem_leak_period_enabled;
  node1.allocation_stage_ = '\0';
  node1.next_ = (MemoryLeakDetectorNode *)0x0;
  node2.size_ = 0;
  node2.number_ = 0;
  node2.memory_ = (char *)0x0;
  node2.file_ = (char *)0x0;
  node2.line_ = 0;
  node2.allocator_ = (TestMemoryAllocator *)0x0;
  node2.period_ = mem_leak_period_enabled;
  node2.allocation_stage_ = '\0';
  node2.next_ = (MemoryLeakDetectorNode *)0x0;
  node3.size_ = 0;
  node3.number_ = 0;
  node3.memory_ = (char *)0x0;
  node3.file_ = (char *)0x0;
  node3.line_ = 0;
  node3.allocator_ = (TestMemoryAllocator *)0x0;
  node3.allocation_stage_ = '\0';
  node3.next_ = (MemoryLeakDetectorNode *)0x0;
  node3.period_ = mem_leak_period_disabled;
  MemoryLeakDetectorList::addNewNode(&listForTesting,&node1);
  MemoryLeakDetectorList::addNewNode(&listForTesting,&node2);
  MemoryLeakDetectorList::addNewNode(&listForTesting,&node3);
  MemoryLeakDetectorList::clearAllAccounting(&listForTesting,mem_leak_period_enabled);
  pUVar1 = UtestShell::getCurrent();
  pMVar2 = MemoryLeakDetectorList::getFirstLeak(&listForTesting,mem_leak_period_enabled);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x13])
            (pUVar1,0,pMVar2,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x230,pTVar3);
  pUVar1 = UtestShell::getCurrent();
  pMVar2 = MemoryLeakDetectorList::getFirstLeak(&listForTesting,mem_leak_period_disabled);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)(&node3 == pMVar2),"CHECK",
             "&node3 == listForTesting.getFirstLeak(mem_leak_period_disabled)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakDetectorTest.cpp"
             ,0x231,pTVar3);
  return;
}

Assistant:

TEST(MemoryLeakDetectorListTest, clearAllAccountingIsWorkingProperly)
{
    MemoryLeakDetectorList listForTesting;
    MemoryLeakDetectorNode node1, node2, node3;
    node3.period_ = mem_leak_period_disabled;
    listForTesting.addNewNode(&node1);
    listForTesting.addNewNode(&node2);
    listForTesting.addNewNode(&node3);

    listForTesting.clearAllAccounting(mem_leak_period_enabled);

    POINTERS_EQUAL(NULLPTR, listForTesting.getFirstLeak(mem_leak_period_enabled));
    CHECK(&node3 == listForTesting.getFirstLeak(mem_leak_period_disabled));
}